

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

PyObject * __thiscall
pybind11::cpp_function::dispatcher
          (cpp_function *this,PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  ushort uVar1;
  PyTypeObject *pPVar2;
  char *key;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *pvVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  type_info *find_type;
  PyObject *pPVar11;
  undefined8 extraout_RAX;
  handle hVar12;
  undefined8 *puVar13;
  long *plVar14;
  long lVar15;
  function_record *pfVar16;
  function_record *pfVar17;
  object *poVar18;
  error_already_set *this_00;
  pointer paVar19;
  instance *piVar20;
  ulong uVar21;
  uint uVar22;
  PyObject *tmp;
  uint __uval;
  pointer paVar23;
  uint __len;
  pointer paVar24;
  function_record *pfVar25;
  handle hVar26;
  instance *piVar27;
  bool bVar28;
  handle arg;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  function_call call;
  dict kwargs_1;
  dict kwargs;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  undefined1 local_1d8 [24];
  object oStack_1c0;
  function_record *local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  function_record *local_188;
  function_record *local_178;
  function_record *local_170;
  undefined4 local_164;
  instance *local_160;
  undefined1 local_158 [8];
  undefined1 auStack_150 [16];
  pointer paStack_140;
  anon_union_24_2_63b86169_for_instance_1 local_138;
  handle hStack_120;
  function_record *local_118;
  object oStack_110;
  object local_108;
  handle local_100;
  handle local_f8;
  handle local_f0;
  handle local_e8;
  long local_e0;
  PyObject local_d8;
  undefined1 local_c8 [32];
  pointer local_a8;
  PyTypeObject *local_a0;
  uint local_94;
  pointer local_90;
  PyObject *local_88;
  instance *local_78;
  instance *piStack_70;
  type_info *local_68;
  pointer paStack_60;
  pointer local_50;
  handle local_48;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_40;
  
  local_160 = (instance *)PyCapsule_GetPointer(this,0);
  if ((self->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_c_cmakelists/hezhaozhao-git[P]thrift_rpc_code_generate/pybind11/include/pybind11/pybind11.h"
                  ,0x23d,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  paVar23 = (pointer)self[1].ob_refcnt;
  if (paVar23 == (pointer)0x0) {
    local_a0 = (PyTypeObject *)0x0;
  }
  else {
    local_a0 = self[1].ob_type;
  }
  pPVar2 = local_a0;
  local_68 = (type_info *)0x0;
  paStack_60 = (pointer)0x0;
  local_78 = (instance *)0x0;
  piStack_70 = (instance *)0x0;
  local_178 = (function_record *)self;
  if ((*(undefined1 *)((long)&local_160[1].field_1 + 0x11) & 1) != 0) {
    if ((local_a0 == (PyTypeObject *)0x0) ||
       (((local_a0->ob_base).ob_base.ob_type != (PyTypeObject *)local_160[2].ob_base.ob_refcnt &&
        (iVar9 = PyType_IsSubtype(), iVar9 == 0)))) {
      PyErr_SetString(_PyExc_TypeError,
                      "__init__(self, ...) called with invalid or missing `self` argument");
      return (PyObject *)0x0;
    }
    find_type = detail::get_type_info((PyTypeObject *)local_160[2].ob_base.ob_refcnt);
    detail::instance::get_value_and_holder
              ((value_and_holder *)local_158,(instance *)pPVar2,find_type,true);
    local_68 = (type_info *)auStack_150._8_8_;
    paStack_60 = paStack_140;
    local_78 = (instance *)local_158;
    piStack_70 = (instance *)auStack_150._0_8_;
    bVar8 = (byte)((PyObject *)((long)local_158 + 0x30))->ob_refcnt;
    if ((bVar8 & 2) == 0) {
      bVar8 = *(byte *)((long)&((PyObject *)auStack_150._0_8_)->ob_refcnt +
                       (long)&(((PyObject *)((long)local_158 + 0x10))->ob_type->ob_base).ob_base.
                              ob_refcnt) & 2;
      kwargs_in = (PyObject *)auStack_150._0_8_;
    }
    else {
      bVar8 = bVar8 & 8;
      kwargs_in = (PyObject *)local_158;
    }
    if (bVar8 != 0) {
      __Py_NoneStruct = __Py_NoneStruct + 1;
      local_158 = (undefined1  [8])0x0;
      object::~object((object *)local_158);
      return (PyObject *)&_Py_NoneStruct;
    }
  }
  local_c8._0_8_ = (PyObject *)0x0;
  local_c8._8_8_ = (function_record *)0x0;
  local_c8._16_8_ = (pointer)0x0;
  local_170 = (function_record *)args_in;
  if (local_160 == (instance *)0x0) {
    local_164 = 0;
    hVar12.m_ptr = (PyObject *)0x1;
  }
  else {
    local_164 = (undefined4)
                CONCAT71((int7)((ulong)kwargs_in >> 8),
                         local_160[2].field_1.simple_value_holder[0] != (void *)0x0);
    local_40 = &local_178->args;
    local_88 = (PyObject *)0x1;
    hVar26.m_ptr = &local_160->ob_base;
    local_a8 = paVar23;
    do {
      uVar1 = *(ushort *)((long)&hVar26.m_ptr[5].ob_type + 1);
      uVar22 = (uVar1 & 0x20) >> 5;
      local_50 = (pointer)((long)(short)((uint)(int)(short)(uVar1 << 9) >> 0xf) +
                          ((ulong)*(ushort *)((long)&hVar26.m_ptr[5].ob_type + 4) - (ulong)uVar22));
      paVar19 = local_50 + -(ulong)*(ushort *)((long)&hVar26.m_ptr[5].ob_type + 6);
      if (((uVar22 == 0) && (paVar19 < paVar23)) ||
         ((local_90 = paVar19, paVar23 < paVar19 &&
          ((pointer)(hVar26.m_ptr[2].ob_refcnt - (long)hVar26.m_ptr[1].ob_type >> 5) < paVar19)))) {
        bVar28 = false;
      }
      else {
        local_138.simple_value_holder[2] = (function_record *)0x0;
        hStack_120.m_ptr = hStack_120.m_ptr & 0xffffffff00000000;
        local_138.simple_value_holder[1] =
             (void *)((ulong)local_138.simple_value_holder[1] & 0xffffffff00000000);
        paStack_140 = (pointer)0x0;
        local_138.simple_value_holder[0] = (function_record *)0x0;
        auStack_150._0_8_ = (instance *)0x0;
        auStack_150._8_8_ = (type_info *)0x0;
        local_108.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_118 = (function_record *)0x0;
        oStack_110.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_100.m_ptr = (PyObject *)local_a0;
        local_f8.m_ptr = (PyObject *)0x0;
        local_158 = (undefined1  [8])hVar26.m_ptr;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_150,
                   (ulong)*(ushort *)((long)&hVar26.m_ptr[5].ob_type + 4));
        std::vector<bool,_std::allocator<bool>_>::reserve
                  ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,
                   (ulong)*(ushort *)((long)&hVar26.m_ptr[5].ob_type + 4));
        paVar19 = local_90;
        if (paVar23 < local_90) {
          paVar19 = paVar23;
        }
        if (((ulong)hVar26.m_ptr[5].ob_type & 0x200) == 0) {
          paVar24 = (pointer)0x0;
        }
        else {
          if (*(PyObject **)&paStack_60->field_0x0 != (PyObject *)0x0) {
            (*(code *)*(PyObject **)(local_68 + 0x38))(&stack0xffffffffffffff88);
          }
          if ((((PyTypeObject *)
               (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_178->doc)->
               super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
               super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args_in)",
                          "/workspace/llm4binary/github/license_c_cmakelists/hezhaozhao-git[P]thrift_rpc_code_generate/pybind11/include/pybind11/pybind11.h"
                          ,0x28a,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          local_f8.m_ptr =
               *(PyObject **)
                &(local_178->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data;
          local_1d8._0_8_ = &stack0xffffffffffffff88;
          if ((pointer)auStack_150._8_8_ == paStack_140) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<_object*>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_150,
                       (iterator)auStack_150._8_8_,(_object **)local_1d8);
          }
          else {
            *(PyObject **)auStack_150._8_8_ = (PyObject *)local_1d8._0_8_;
            auStack_150._8_8_ = auStack_150._8_8_ + 8;
          }
          paVar24 = (pointer)0x1;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,false);
        }
        if (paVar24 < paVar19) {
          uVar21 = (ulong)(uint)((int)paVar24 << 5);
          bVar28 = false;
          do {
            puVar13 = (undefined8 *)
                      ((long)&((hVar26.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + uVar21);
            if ((pointer)(hVar26.m_ptr[2].ob_refcnt - (long)hVar26.m_ptr[1].ob_type >> 5) <= paVar24
               ) {
              puVar13 = (undefined8 *)0x0;
            }
            if ((((local_170 == (function_record *)0x0) || (puVar13 == (undefined8 *)0x0)) ||
                ((char *)*puVar13 == (char *)0x0)) ||
               (pPVar11 = detail::dict_getitemstring((PyObject *)local_170,(char *)*puVar13),
               pPVar11 == (PyObject *)0x0)) {
              if ((((PyTypeObject *)
                   (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_178->doc)
                   ->super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>).
                   _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_c_cmakelists/hezhaozhao-git[P]thrift_rpc_code_generate/pybind11/include/pybind11/pybind11.h"
                              ,0x299,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_1d8._0_8_ = local_178->data[(long)(paVar24 + -4)];
              if (((puVar13 == (undefined8 *)0x0) || ((*(byte *)(puVar13 + 3) & 2) != 0)) ||
                 ((function_record *)local_1d8._0_8_ != (function_record *)&_Py_NoneStruct)) {
                if ((pointer)auStack_150._8_8_ == paStack_140) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)
                             auStack_150,(iterator)auStack_150._8_8_,(handle *)local_1d8);
                }
                else {
                  *(PyObject **)auStack_150._8_8_ = (PyObject *)local_1d8._0_8_;
                  auStack_150._8_8_ = auStack_150._8_8_ + 8;
                }
                bVar3 = true;
                bVar8 = 1;
                if (puVar13 != (undefined8 *)0x0) {
                  bVar8 = *(byte *)(puVar13 + 3);
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,
                           (bool)(bVar8 & 1));
              }
              else {
                bVar3 = false;
                bVar28 = true;
              }
            }
            else {
              bVar28 = true;
              bVar3 = false;
            }
            if (!bVar3) break;
            paVar24 = paVar24 + 1;
            uVar21 = uVar21 + 0x20;
          } while (paVar19 != paVar24);
        }
        else {
          bVar28 = false;
        }
        paVar23 = local_a8;
        if (bVar28) {
          bVar28 = false;
        }
        else {
          local_e8.m_ptr = (PyObject *)local_170;
          if (local_170 != (function_record *)0x0) {
            local_170->name = (char *)((long)&((function_record *)local_170->name)->name + 1);
          }
          if (paVar24 < (pointer)(ulong)(ushort)hVar26.m_ptr[6].ob_refcnt) {
            if (paVar24 < (pointer)(ulong)(ushort)hVar26.m_ptr[6].ob_refcnt) {
              uVar21 = (long)paVar24 << 5 | 0x10;
              do {
                pPVar2 = hVar26.m_ptr[1].ob_type;
                local_1d8._0_8_ = (function_record *)0x0;
                if (*(long *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + uVar21) != 0) {
                  local_1d8._0_8_ =
                       *(undefined8 *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + uVar21);
                }
                uVar4 = local_1d8._0_8_;
                if ((function_record *)local_1d8._0_8_ == (function_record *)0x0) break;
                if ((pointer)auStack_150._8_8_ == paStack_140) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)
                             auStack_150,(iterator)auStack_150._8_8_,(handle *)local_1d8);
                }
                else {
                  *(PyObject **)auStack_150._8_8_ = (PyObject *)local_1d8._0_8_;
                  auStack_150._8_8_ = auStack_150._8_8_ + 8;
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,
                           (bool)(*(byte *)((long)&(pPVar2->ob_base).ob_base.ob_type + uVar21) & 1))
                ;
                if ((function_record *)uVar4 == (function_record *)0x0) break;
                paVar24 = paVar24 + 1;
                uVar21 = uVar21 + 0x20;
              } while (paVar24 < (pointer)(ulong)(ushort)hVar26.m_ptr[6].ob_refcnt);
            }
            if ((pointer)(ulong)(ushort)hVar26.m_ptr[6].ob_refcnt <= paVar24) goto LAB_00130e6a;
LAB_00131004:
            bVar28 = false;
          }
          else {
LAB_00130e6a:
            if (paVar24 < local_50) {
              uVar21 = (long)paVar24 << 5 | 0x18;
              bVar28 = true;
              local_94 = 0;
              do {
                pPVar2 = hVar26.m_ptr[1].ob_type;
                local_1d8._0_8_ = (function_record *)0x0;
                if ((local_170 != (function_record *)0x0) &&
                   (key = *(char **)((long)pPVar2 + (uVar21 - 0x18)), key != (char *)0x0)) {
                  local_1d8._0_8_ = detail::dict_getitemstring(local_e8.m_ptr,key);
                }
                if ((function_record *)local_1d8._0_8_ == (function_record *)0x0) {
                  if (*(long *)((long)pPVar2 + (uVar21 - 8)) != 0) {
                    local_1d8._0_8_ = *(undefined8 *)((long)pPVar2 + (uVar21 - 8));
                  }
                }
                else {
                  if ((local_94 & 1) == 0) {
                    local_1a8._0_8_ = PyDict_Copy(local_e8.m_ptr);
                    object::operator=((object *)&local_e8,(object *)local_1a8);
                    object::~object((object *)local_1a8);
                    local_94 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                  }
                  iVar9 = PyDict_DelItemString(local_e8.m_ptr);
                  if (iVar9 == -1) {
                    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
                    error_already_set::error_already_set(this_00);
                    __cxa_throw(this_00,&error_already_set::typeinfo,
                                error_already_set::~error_already_set);
                  }
                }
                if (((function_record *)local_1d8._0_8_ != (function_record *)0x0 &
                    ((function_record *)local_1d8._0_8_ != (function_record *)&_Py_NoneStruct |
                    *(byte *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + uVar21) >> 1)) != 1) {
                  if (bVar28) {
                    bVar28 = false;
                    paVar23 = local_a8;
                    goto LAB_00131479;
                  }
                  break;
                }
                if ((pointer)auStack_150._8_8_ == paStack_140) {
                  std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                  _M_realloc_insert<pybind11::handle_const&>
                            ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)
                             auStack_150,(iterator)auStack_150._8_8_,(handle *)local_1d8);
                }
                else {
                  *(PyObject **)auStack_150._8_8_ = (PyObject *)local_1d8._0_8_;
                  auStack_150._8_8_ = auStack_150._8_8_ + 8;
                }
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,
                           (bool)(*(byte *)((long)&(pPVar2->ob_base).ob_base.ob_refcnt + uVar21) & 1
                                 ));
                paVar24 = paVar24 + 1;
                uVar21 = uVar21 + 0x20;
                bVar28 = paVar24 < local_50;
              } while (bVar28);
            }
            paVar23 = local_a8;
            if ((((function_record *)local_e8.m_ptr != (function_record *)0x0) &&
                (lVar15 = PyDict_Size(), lVar15 != 0)) &&
               (((ulong)hVar26.m_ptr[5].ob_type & 0x4000) == 0)) goto LAB_00131004;
            if (((ulong)hVar26.m_ptr[5].ob_type & 0x2000) != 0) {
              tuple::tuple((tuple *)local_1a8,0);
              if (paVar19 == (pointer)0x0) {
                local_1d8._0_8_ = local_178;
                if (local_178 != (function_record *)0x0) {
                  local_178->name = (char *)((long)&((function_record *)local_178->name)->name + 1);
                }
LAB_001310f6:
                object::operator=((object *)local_1a8,(object *)local_1d8);
                object::~object((object *)local_1d8);
              }
              else {
                pfVar25 = (function_record *)(paVar23 + -(long)paVar24);
                if (paVar23 < paVar24 || pfVar25 == (function_record *)0x0) {
                  tuple::tuple((tuple *)local_1d8,0);
                  goto LAB_001310f6;
                }
                tuple::tuple((tuple *)local_1d8,(size_t)pfVar25);
                object::operator=((object *)local_1a8,(object *)local_1d8);
                object::~object((object *)local_1d8);
                pvVar7 = local_40;
                if (paVar23 != paVar24) {
                  pfVar16 = (function_record *)0x0;
                  do {
                    if ((((PyTypeObject *)
                         (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                          &local_178->doc)->
                         super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>).
                         _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                      __assert_fail("PyTuple_Check(args_in)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/hezhaozhao-git[P]thrift_rpc_code_generate/pybind11/include/pybind11/pybind11.h"
                                    ,0x2f4,
                                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                                   );
                    }
                    local_1d8._8_8_ = local_1a8._0_8_;
                    oStack_1c0.super_handle.m_ptr = (handle)(PyObject *)0x0;
                    local_1d8._16_8_ = pfVar16;
                    detail::accessor_policies::tuple_item::set
                              ((handle)local_1a8._0_8_,(size_t)pfVar16,
                               *(PyObject **)
                                ((long)&(pvVar7->
                                        super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                        )._M_impl.super__Vector_impl_data +
                                (long)(paVar24 + (long)pfVar16) * 8));
                    object::~object((object *)(local_1d8 + 0x18));
                    pfVar16 = (function_record *)((long)&pfVar16->name + 1);
                  } while (pfVar25 != pfVar16);
                }
              }
              if ((pointer)auStack_150._8_8_ == paStack_140) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_150,
                           (iterator)auStack_150._8_8_,(handle *)local_1a8);
              }
              else {
                *(PyObject **)auStack_150._8_8_ = (PyObject *)local_1a8._0_8_;
                auStack_150._8_8_ = auStack_150._8_8_ + 8;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,false);
              object::operator=(&oStack_110,(object *)local_1a8);
              object::~object((object *)local_1a8);
            }
            if (((ulong)hVar26.m_ptr[5].ob_type & 0x4000) != 0) {
              if ((function_record *)local_e8.m_ptr == (function_record *)0x0) {
                dict::dict((dict *)local_1d8);
                object::operator=((object *)&local_e8,(object *)local_1d8);
                object::~object((object *)local_1d8);
              }
              if ((pointer)auStack_150._8_8_ == paStack_140) {
                std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
                _M_realloc_insert<pybind11::handle_const&>
                          ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_150,
                           (iterator)auStack_150._8_8_,&local_e8);
              }
              else {
                *(PyObject **)auStack_150._8_8_ = local_e8.m_ptr;
                auStack_150._8_8_ = auStack_150._8_8_ + 8;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,false);
              object::operator=(&local_108,(object *)&local_e8);
            }
            uVar21 = (ulong)*(ushort *)((long)&hVar26.m_ptr[5].ob_type + 4);
            if (((long)(auStack_150._8_8_ - auStack_150._0_8_) >> 3 != uVar21) ||
               (((ulong)hStack_120.m_ptr & 0xffffffff) +
                ((long)local_138.simple_value_holder[2] - local_138._0_8_) * 8 != uVar21)) {
              pybind11_fail(
                           "Internal error: function call dispatcher inserted wrong number of arguments!"
                           );
            }
            local_1a8._0_8_ = (PyObject *)0x0;
            local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
            local_198._0_8_ = (function_record *)0x0;
            local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
            local_188 = (function_record *)0x0;
            if ((byte)local_164 != '\0') {
              std::vector<bool,_std::allocator<bool>_>::resize
                        ((vector<bool,_std::allocator<bool>_> *)local_1a8,uVar21,false);
              pfVar25 = local_118;
              hVar12.m_ptr = hStack_120.m_ptr;
              uVar6 = local_138.simple_value_holder[2];
              uVar5 = local_138.simple_value_holder[1];
              uVar4 = local_138.simple_value_holder[0];
              local_1b8 = local_118;
              local_1d8._16_8_ = local_138.simple_value_holder[2];
              oStack_1c0.super_handle.m_ptr = (handle)(handle)hStack_120.m_ptr;
              local_1d8._0_8_ = local_138.simple_value_holder[0];
              local_1d8._8_8_ = local_138.simple_value_holder[1];
              local_118 = local_188;
              local_138.simple_value_holder[2] = (void *)local_198._0_8_;
              hStack_120.m_ptr = (PyObject *)local_198._8_8_;
              local_138.simple_value_holder[0] = (void *)local_1a8._0_8_;
              local_138.simple_value_holder[1] = (void *)local_1a8._8_8_;
              local_1a8._0_8_ = uVar4;
              local_1a8._8_8_ = uVar5;
              local_198._0_8_ = uVar6;
              local_198._8_8_ = hVar12.m_ptr;
              local_188 = pfVar25;
            }
            detail::loader_life_support::loader_life_support((loader_life_support *)local_1d8);
            local_88 = (PyObject *)(*(code *)hVar26.m_ptr[3].ob_refcnt)(local_158);
            detail::loader_life_support::~loader_life_support((loader_life_support *)local_1d8);
            pfVar25 = local_118;
            hVar12.m_ptr = hStack_120.m_ptr;
            uVar6 = local_138.simple_value_holder[2];
            uVar5 = local_138.simple_value_holder[1];
            uVar4 = local_138.simple_value_holder[0];
            bVar28 = local_88 != (PyObject *)0x1;
            if (((byte)local_164 & local_88 == (PyObject *)0x1) != 0) {
              bVar28 = false;
              for (paVar19 = (pointer)(ulong)(*(ushort *)((long)&hVar26.m_ptr[5].ob_type + 1) >> 4 &
                                             1); paVar19 < local_90; paVar19 = paVar19 + 1) {
                paVar24 = paVar19 + 0x3f;
                if (-1 < (long)paVar19) {
                  paVar24 = paVar19;
                }
                if ((*(ulong *)(local_1a8._0_8_ +
                               (ulong)(((ulong)paVar19 & 0x800000000000003f) < 0x8000000000000001) *
                               8 + ((long)paVar24 >> 6) * 8 + -8) >> ((ulong)paVar19 & 0x3f) & 1) !=
                    0) {
                  local_1b8 = local_118;
                  local_1d8._16_8_ = local_138.simple_value_holder[2];
                  oStack_1c0.super_handle.m_ptr = (handle)(handle)hStack_120.m_ptr;
                  local_1d8._0_8_ = local_138.simple_value_holder[0];
                  local_1d8._8_8_ = local_138.simple_value_holder[1];
                  bVar28 = false;
                  local_118 = local_188;
                  local_138.simple_value_holder[2] = (void *)local_198._0_8_;
                  hStack_120.m_ptr = (PyObject *)local_198._8_8_;
                  local_138.simple_value_holder[0] = (void *)local_1a8._0_8_;
                  local_138.simple_value_holder[1] = (void *)local_1a8._8_8_;
                  local_1a8._0_8_ = uVar4;
                  local_1a8._8_8_ = uVar5;
                  local_198._0_8_ = uVar6;
                  local_198._8_8_ = hVar12.m_ptr;
                  local_188 = pfVar25;
                  std::
                  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                  ::emplace_back<pybind11::detail::function_call>
                            ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              *)local_c8,(function_call *)local_158);
                  break;
                }
              }
            }
            if ((function_record *)local_1a8._0_8_ != (function_record *)0x0) {
              operator_delete((void *)local_1a8._0_8_);
              local_1a8._0_8_ = (PyObject *)0x0;
              local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
              local_198._0_8_ = (function_record *)0x0;
              local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
              local_188 = (function_record *)0x0;
            }
          }
LAB_00131479:
          object::~object((object *)&local_e8);
        }
        object::~object(&local_108);
        object::~object(&oStack_110);
        if ((function_record *)local_138.simple_value_holder[0] != (function_record *)0x0) {
          operator_delete(local_138.simple_value_holder[0]);
          local_138.simple_value_holder[0] = (function_record *)0x0;
          local_138.simple_value_holder[1] =
               (void *)((ulong)local_138.simple_value_holder[1] & 0xffffffff00000000);
          local_138.simple_value_holder[2] = (function_record *)0x0;
          hStack_120.m_ptr = hStack_120.m_ptr & 0xffffffff00000000;
          local_118 = (function_record *)0x0;
        }
        if ((instance *)auStack_150._0_8_ != (instance *)0x0) {
          operator_delete((void *)auStack_150._0_8_);
        }
      }
      hVar12.m_ptr = local_88;
    } while ((!bVar28) &&
            (hVar26.m_ptr = (PyObject *)hVar26.m_ptr[8].ob_refcnt,
            (instance *)hVar26.m_ptr != (instance *)0x0));
  }
  uVar4 = local_c8._8_8_;
  if (((byte)local_164 != '\0') &&
     ((local_c8._0_8_ != local_c8._8_8_ && (hVar12.m_ptr == (PyObject *)0x1)))) {
    pfVar25 = (function_record *)local_c8._0_8_;
    do {
      detail::loader_life_support::loader_life_support((loader_life_support *)local_158);
      hVar12 = (*((function_record *)pfVar25->name)->impl)((function_call *)pfVar25);
      detail::loader_life_support::~loader_life_support((loader_life_support *)local_158);
      if (hVar12.m_ptr != (PyObject *)0x1) break;
      pfVar25 = (function_record *)&pfVar25->def;
    } while (pfVar25 != (function_record *)uVar4);
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           *)local_c8);
  piVar27 = local_160;
  if (hVar12.m_ptr == (PyObject *)0x0) {
    local_158 = (undefined1  [8])(auStack_150 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,
               "Unable to convert function return value to a Python type! The signature was\n\t","")
    ;
    std::__cxx11::string::append(local_158);
    lVar15 = std::__cxx11::string::find(local_158,0x378b69,0);
    if (lVar15 != -1) {
      std::__cxx11::string::append(local_158);
    }
    PyErr_SetString(_PyExc_TypeError,local_158);
    if (local_158 == (undefined1  [8])(auStack_150 + 8)) {
      return (PyObject *)0x0;
    }
    goto LAB_00132125;
  }
  if (hVar12.m_ptr != (PyObject *)0x1) {
    if ((*(undefined1 *)((long)&local_160[1].field_1 + 0x11) & 1) == 0) {
      return hVar12.m_ptr;
    }
    if ((local_78->field_0x30 & 2) == 0) {
      bVar8 = *(byte *)((long)&(piStack_70->ob_base).ob_refcnt +
                       (long)(local_78->field_1).simple_value_holder[1]) & 1;
    }
    else {
      bVar8 = local_78->field_0x30 & 4;
    }
    if (bVar8 == 0) {
      (*(code *)*(PyObject **)(local_68 + 0x30))(local_a0,0);
      return hVar12.m_ptr;
    }
    return hVar12.m_ptr;
  }
  if ((*(undefined1 *)((long)&local_160[1].field_1 + 0x11) & 8) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string
            ((string *)local_c8,(char *)(local_160->ob_base).ob_refcnt,(allocator *)&local_f0);
  puVar13 = (undefined8 *)std::__cxx11::string::append(local_c8);
  pfVar25 = (function_record *)(puVar13 + 2);
  if ((function_record *)*puVar13 == pfVar25) {
    local_198._0_8_ = pfVar25->name;
    local_198._8_8_ = puVar13[3];
    local_1a8._0_8_ = (PyObject *)local_198;
  }
  else {
    local_198._0_8_ = pfVar25->name;
    local_1a8._0_8_ = (PyObject *)*puVar13;
  }
  local_1a8._8_8_ = puVar13[1];
  *puVar13 = pfVar25;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  uVar1 = *(ushort *)((long)&piVar27[1].field_1 + 0x11);
  iVar9 = 0x39edca;
  if ((uVar1 & 1) != 0) {
    iVar9 = 0x3788a4;
  }
  local_e8.m_ptr = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,iVar9,iVar9 + (uVar1 & 1) * 3 + 8);
  pfVar25 = (function_record *)((long)(function_record **)local_1a8._8_8_ + local_e0);
  pfVar16 = (function_record *)0xf;
  if ((PyObject *)local_1a8._0_8_ != (PyObject *)local_198) {
    pfVar16 = (function_record *)local_198._0_8_;
  }
  if (pfVar16 < pfVar25) {
    pfVar16 = (function_record *)0xf;
    if (local_e8.m_ptr != &local_d8) {
      pfVar16 = (function_record *)local_d8.ob_refcnt;
    }
    if (pfVar16 < pfVar25) goto LAB_0013182b;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,local_1a8._0_8_);
  }
  else {
LAB_0013182b:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_1a8,(ulong)local_e8.m_ptr);
  }
  local_1d8._0_8_ = local_1d8 + 0x10;
  pfVar25 = (function_record *)(puVar13 + 2);
  if ((function_record *)*puVar13 == pfVar25) {
    local_1d8._16_8_ = pfVar25->name;
    oStack_1c0.super_handle.m_ptr = (handle)puVar13[3];
  }
  else {
    local_1d8._16_8_ = pfVar25->name;
    local_1d8._0_8_ = (function_record *)*puVar13;
  }
  local_1d8._8_8_ = puVar13[1];
  *puVar13 = pfVar25;
  puVar13[1] = 0;
  *(undefined1 *)&pfVar25->name = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_1d8);
  local_158 = (undefined1  [8])(auStack_150 + 8);
  piVar20 = (instance *)(plVar14 + 2);
  if ((instance *)*plVar14 == piVar20) {
    auStack_150._8_8_ = (piVar20->ob_base).ob_refcnt;
    paStack_140 = (pointer)plVar14[3];
  }
  else {
    auStack_150._8_8_ = (piVar20->ob_base).ob_refcnt;
    local_158 = (undefined1  [8])*plVar14;
  }
  auStack_150._0_8_ = plVar14[1];
  *plVar14 = (long)piVar20;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((function_record *)local_1d8._0_8_ != (function_record *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_);
  }
  if (local_e8.m_ptr != &local_d8) {
    operator_delete(local_e8.m_ptr);
  }
  if ((PyObject *)local_1a8._0_8_ != (PyObject *)local_198) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if ((function_record *)local_c8._0_8_ != (function_record *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_);
  }
  uVar22 = 0;
  do {
    __val = uVar22 + 1;
    __len = 1;
    if (8 < uVar22) {
      uVar21 = (ulong)__val;
      uVar22 = 4;
      do {
        __len = uVar22;
        uVar10 = (uint)uVar21;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_001319a3;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_001319a3;
        }
        if (uVar10 < 10000) goto LAB_001319a3;
        uVar21 = uVar21 / 10000;
        uVar22 = __len + 4;
      } while (99999 < uVar10);
      __len = __len + 1;
    }
LAB_001319a3:
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_c8,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c8._0_8_,__len,__val);
    puVar13 = (undefined8 *)std::__cxx11::string::replace((ulong)local_c8,0,(char *)0x0,0x379164);
    local_1a8._0_8_ = local_198;
    pfVar25 = (function_record *)(puVar13 + 2);
    if ((function_record *)*puVar13 == pfVar25) {
      local_198._0_8_ = pfVar25->name;
      local_198._8_8_ = puVar13[3];
    }
    else {
      local_198._0_8_ = pfVar25->name;
      local_1a8._0_8_ = (PyObject *)*puVar13;
    }
    local_1a8._8_8_ = puVar13[1];
    *puVar13 = pfVar25;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_1a8);
    local_1d8._0_8_ = local_1d8 + 0x10;
    pfVar25 = (function_record *)(puVar13 + 2);
    if ((function_record *)*puVar13 == pfVar25) {
      local_1d8._16_8_ = pfVar25->name;
      oStack_1c0.super_handle.m_ptr = (handle)puVar13[3];
    }
    else {
      local_1d8._16_8_ = pfVar25->name;
      local_1d8._0_8_ = (function_record *)*puVar13;
    }
    local_1d8._8_8_ = puVar13[1];
    *puVar13 = pfVar25;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_158,local_1d8._0_8_);
    if ((function_record *)local_1d8._0_8_ != (function_record *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if ((function_record *)local_1a8._0_8_ != (function_record *)local_198) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if ((function_record *)local_c8._0_8_ != (function_record *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_);
    }
    if ((*(undefined1 *)((long)&local_160[1].field_1 + 0x11) & 1) == 0) {
LAB_00131c01:
      std::__cxx11::string::append((char *)local_158);
    }
    else {
      std::__cxx11::string::string
                ((string *)local_1d8,(char *)(piVar27->field_1).nonsimple.values_and_holders,
                 (allocator *)local_1a8);
      lVar15 = std::__cxx11::string::find((char)(string *)local_1d8,0x28);
      pfVar25 = (function_record *)(lVar15 + 7);
      if ((ulong)local_1d8._8_8_ <= pfVar25) {
LAB_00131bed:
        if ((function_record *)local_1d8._0_8_ != (function_record *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_);
        }
        goto LAB_00131c01;
      }
      pfVar16 = (function_record *)std::__cxx11::string::find(local_1d8,0x3a9b9f,0);
      std::__cxx11::string::rfind(local_1d8,0x3a686f,0xffffffffffffffff);
      if (pfVar16 < (ulong)local_1d8._8_8_) {
        pfVar17 = (function_record *)((long)&pfVar16->name + 2);
      }
      else {
        pfVar17 = (function_record *)std::__cxx11::string::find((char)local_1d8,0x29);
        pfVar16 = pfVar17;
      }
      if ((pfVar16 <= pfVar25) || ((ulong)local_1d8._8_8_ <= pfVar17)) goto LAB_00131bed;
      std::__cxx11::string::append((string *)local_158,(ulong)local_1d8,(ulong)pfVar25);
      std::__cxx11::string::push_back((char)(string *)local_158);
      std::__cxx11::string::append((string *)local_158,(ulong)local_1d8,(ulong)pfVar17);
      if ((function_record *)local_1d8._0_8_ != (function_record *)(local_1d8 + 0x10)) {
        operator_delete((void *)local_1d8._0_8_);
      }
    }
    std::__cxx11::string::append((char *)local_158);
    piVar27 = (instance *)piVar27[2].field_1.simple_value_holder[0];
    uVar22 = __val;
  } while (piVar27 != (instance *)0x0);
  std::__cxx11::string::append(local_158);
  local_e8.m_ptr = (PyObject *)local_178;
  if (local_178 != (function_record *)0x0) {
    local_178->name = (char *)((long)&((function_record *)local_178->name)->name + 1);
  }
  bVar28 = false;
  for (pfVar25 = (function_record *)(ulong)(*(ushort *)((long)&local_160[1].field_1 + 0x11) & 1);
      pfVar16 = (function_record *)PyTuple_Size(local_e8.m_ptr), pfVar25 < pfVar16;
      pfVar25 = (function_record *)((long)&pfVar25->name + 1)) {
    bVar3 = true;
    if (bVar28) {
      std::__cxx11::string::append(local_158);
      bVar3 = bVar28;
    }
    bVar28 = bVar3;
    local_1a8._8_8_ = local_e8.m_ptr;
    local_198._8_8_ = (PyObject *)0x0;
    local_198._0_8_ = pfVar25;
    poVar18 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_1a8);
    local_f0.m_ptr = (poVar18->super_handle).m_ptr;
    if ((function_record *)local_f0.m_ptr != (function_record *)0x0) {
      ((function_record *)local_f0.m_ptr)->name =
           (char *)((long)&((function_record *)((function_record *)local_f0.m_ptr)->name)->name + 1)
      ;
    }
    hVar12.m_ptr = (PyObject *)PyObject_Repr(local_f0.m_ptr);
    if ((function_record *)hVar12.m_ptr == (function_record *)0x0) {
      local_178 = (function_record *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set((error_already_set *)local_178);
      __cxa_throw(local_178,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_c8._0_8_ = hVar12.m_ptr;
    pybind11::str::operator_cast_to_string((string *)local_1d8,(str *)local_c8);
    std::__cxx11::string::_M_append(local_158,local_1d8._0_8_);
    if ((function_record *)local_1d8._0_8_ != (function_record *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
    object::~object((object *)local_c8);
    object::~object((object *)&local_f0);
    object::~object((object *)(local_198 + 8));
  }
  if (local_170 != (function_record *)0x0) {
    local_f0.m_ptr = (PyObject *)local_170;
    local_170->name = (char *)((long)&((function_record *)local_170->name)->name + 1);
    lVar15 = PyDict_Size();
    if (lVar15 != 0) {
      if (bVar28) {
        std::__cxx11::string::append(local_158);
      }
      std::__cxx11::string::append(local_158);
      local_1d8._0_8_ = local_f0.m_ptr;
      local_1d8._8_8_ = (function_record *)0x0;
      local_1d8._16_8_ = (function_record *)0x0;
      oStack_1c0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      iVar9 = PyDict_Next(local_f0.m_ptr,local_1d8 + 0x18,local_1d8 + 8,local_1d8 + 0x10);
      if (iVar9 == 0) {
        oStack_1c0.super_handle.m_ptr = (handle)(PyObject *)0xffffffffffffffff;
      }
      if (oStack_1c0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff) {
        bVar28 = true;
        do {
          local_c8._0_8_ = local_1d8._8_8_;
          local_c8._8_8_ = local_1d8._16_8_;
          if (bVar28) {
            bVar28 = false;
          }
          else {
            std::__cxx11::string::append(local_158);
          }
          pybind11::str::str((str *)&stack0xffffffffffffffc8,"{}=");
          pybind11::str::format<pybind11::handle&>
                    ((str *)&stack0xffffffffffffffb8,(handle *)&stack0xffffffffffffffc8);
          pybind11::str::operator_cast_to_string
                    ((string *)local_1a8,(str *)&stack0xffffffffffffffb8);
          std::__cxx11::string::_M_append(local_158,local_1a8._0_8_);
          if ((function_record *)local_1a8._0_8_ != (function_record *)local_198) {
            operator_delete((void *)local_1a8._0_8_);
          }
          object::~object((object *)&stack0xffffffffffffffb8);
          object::~object((object *)&stack0xffffffffffffffc8);
          hVar12.m_ptr = (PyObject *)PyObject_Repr(local_c8._8_8_);
          if (hVar12.m_ptr == (PyObject *)0x0) {
            local_178 = (function_record *)__cxa_allocate_exception(0x28);
            error_already_set::error_already_set((error_already_set *)local_178);
            __cxa_throw(local_178,&error_already_set::typeinfo,error_already_set::~error_already_set
                       );
          }
          local_48.m_ptr = hVar12.m_ptr;
          pybind11::str::operator_cast_to_string
                    ((string *)local_1a8,(str *)&stack0xffffffffffffffb8);
          std::__cxx11::string::_M_append(local_158,local_1a8._0_8_);
          if ((PyObject *)local_1a8._0_8_ != (PyObject *)local_198) {
            operator_delete((void *)local_1a8._0_8_);
          }
          object::~object((object *)&stack0xffffffffffffffb8);
          iVar9 = PyDict_Next(local_1d8._0_8_,local_1d8 + 0x18,local_1d8 + 8,local_1d8 + 0x10);
          if (iVar9 == 0) {
            oStack_1c0.super_handle.m_ptr = (handle)(PyObject *)0xffffffffffffffff;
          }
        } while (oStack_1c0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff);
      }
    }
    object::~object((object *)&local_f0);
  }
  lVar15 = std::__cxx11::string::find(local_158,0x378b69,0);
  if (lVar15 != -1) {
    std::__cxx11::string::append(local_158);
  }
  PyErr_SetString(_PyExc_TypeError,local_158);
  object::~object((object *)&local_e8);
  if (local_158 == (undefined1  [8])(auStack_150 + 8)) {
    return (PyObject *)0x0;
  }
LAB_00132125:
  operator_delete((void *)local_158);
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const auto n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            if (!parent || !PyObject_TypeCheck(parent.ptr(), (PyTypeObject *) overloads->scope.ptr())) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid or missing `self` argument");
                return nullptr;
            }

            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, true);

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t num_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --num_args;   // (but don't count py::args
                if (func.has_kwargs) --num_args; //  or py::kwargs)
                size_t pos_args = num_args - func.nargs_kw_only;

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many positional arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough positional arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.emplace_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && dict_getitemstring(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 1.5. Fill in any missing pos_only args from defaults if they exist
                if (args_copied < func.nargs_pos_only) {
                    for (; args_copied < func.nargs_pos_only; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];
                        handle value;

                        if (arg_rec.value) {
                            value = arg_rec.value;
                        }
                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        } else
                            break;
                    }

                    if (args_copied < func.nargs_pos_only)
                        continue; // Not enough defaults to fill the positional arguments
                }

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < num_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < num_args; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg_rec.name)
                            value = dict_getitemstring(kwargs.ptr(), arg_rec.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            if (PyDict_DelItemString(kwargs.ptr(), arg_rec.name) == -1) {
                                throw error_already_set();
                            }
                        } else if (arg_rec.value) {
                            value = arg_rec.value;
                        }

                        if (!arg_rec.none && value.is_none()) {
                            break;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < num_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && !kwargs.empty() && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#ifdef __GLIBCXX__
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                try {
                    msg += pybind11::repr(args_[ti]);
                } catch (const error_already_set&) {
                    msg += "<repr raised Error>";
                }
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (!kwargs.empty()) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}=").format(kwarg.first);
                        try {
                            msg += pybind11::repr(kwarg.second);
                        } catch (const error_already_set&) {
                            msg += "<repr raised Error>";
                        }
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        }
        if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        }
        if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
            auto *pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder.type->init_instance(pi, nullptr);
        }
        return result.ptr();
    }